

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

CURLcode my_sha256_init(my_sha256_ctx *ctx)

{
  EVP_MD_CTX *ctx_00;
  int iVar1;
  EVP_MD_CTX *pEVar2;
  EVP_MD *type;
  my_sha256_ctx *ctx_local;
  
  pEVar2 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  ctx->openssl_ctx = pEVar2;
  if (ctx->openssl_ctx == (EVP_MD_CTX *)0x0) {
    ctx_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    ctx_00 = (EVP_MD_CTX *)ctx->openssl_ctx;
    type = EVP_sha256();
    iVar1 = EVP_DigestInit_ex(ctx_00,type,(ENGINE *)0x0);
    if (iVar1 == 0) {
      EVP_MD_CTX_free(ctx->openssl_ctx);
      ctx_local._4_4_ = CURLE_FAILED_INIT;
    }
    else {
      ctx_local._4_4_ = CURLE_OK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static CURLcode my_sha256_init(my_sha256_ctx *ctx)
{
  ctx->openssl_ctx = EVP_MD_CTX_create();
  if(!ctx->openssl_ctx)
    return CURLE_OUT_OF_MEMORY;

  if(!EVP_DigestInit_ex(ctx->openssl_ctx, EVP_sha256(), NULL)) {
    EVP_MD_CTX_destroy(ctx->openssl_ctx);
    return CURLE_FAILED_INIT;
  }
  return CURLE_OK;
}